

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t cmp_key_wcs(archive_rb_node *n,void *key)

{
  wchar_t *local_30;
  wchar_t *p;
  match_file *f;
  void *key_local;
  archive_rb_node *n_local;
  
  p = (wchar_t *)n;
  f = (match_file *)key;
  key_local = n;
  archive_mstring_get_wcs((archive *)0x0,(archive_mstring *)(n[1].rb_nodes + 1),&local_30);
  if (local_30 == (wchar_t *)0x0) {
    n_local._4_4_ = L'\xffffffff';
  }
  else {
    n_local._4_4_ = wcscmp(local_30,(wchar_t *)f);
  }
  return n_local._4_4_;
}

Assistant:

static int
cmp_key_wcs(const struct archive_rb_node *n, const void *key)
{
	struct match_file *f = (struct match_file *)(uintptr_t)n;
	const wchar_t *p;

	archive_mstring_get_wcs(NULL, &(f->pathname), &p);
	if (p == NULL)
		return (-1);
	return (wcscmp(p, (const wchar_t *)key));
}